

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.h
# Opt level: O3

void __thiscall cursespp::ShortcutsWindow::Entry::~Entry(Entry *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->description)._M_dataplus._M_p;
  paVar2 = &(this->description).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->key)._M_dataplus._M_p;
  paVar2 = &(this->key).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Entry(const std::string& key, const std::string& desc, int64_t attrs = -1) {
                    this->key = key;
                    this->description = desc;
                    this->attrs = attrs;
                }